

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateFrameworkMethods
          (MessageGenerator *this,Printer *printer)

{
  mapped_type *this_00;
  FieldGeneratorBase *pFVar1;
  Descriptor *pDVar2;
  int i_1;
  long lVar3;
  int i;
  long lVar4;
  allocator local_a1;
  string local_a0;
  key_type local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  class_name_abi_cxx11_(&local_a0,this);
  std::__cxx11::string::string((string *)&local_80,"class_name",&local_a1);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&local_80);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public override bool Equals(object other) {\n  return Equals(other as $class_name$);\n}\n\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public bool Equals($class_name$ other) {\n  if (ReferenceEquals(other, null)) {\n    return false;\n  }\n  if (ReferenceEquals(other, this)) {\n    return true;\n  }\n"
                    );
  io::Printer::Indent(printer);
  lVar3 = 0;
  for (lVar4 = 0; pDVar2 = this->descriptor_, lVar4 < *(int *)(pDVar2 + 4); lVar4 = lVar4 + 1) {
    pFVar1 = CreateFieldGeneratorInternal
                       (this,(FieldDescriptor *)(*(long *)(pDVar2 + 0x28) + lVar3));
    (*(pFVar1->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xe])(pFVar1,printer);
    (*(pFVar1->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar1);
    lVar3 = lVar3 + 0x48;
  }
  lVar3 = 8;
  for (lVar4 = 0; lVar4 < *(int *)(pDVar2 + 0x6c); lVar4 = lVar4 + 1) {
    UnderscoresToCamelCase(&local_a0,*(string **)(*(long *)(pDVar2 + 0x30) + lVar3),true);
    io::Printer::Print<char[14],std::__cxx11::string>
              (printer,"if ($property_name$Case != other.$property_name$Case) return false;\n",
               (char (*) [14])0x3f0556,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    pDVar2 = this->descriptor_;
    lVar3 = lVar3 + 0x28;
  }
  if (this->has_extension_ranges_ != false) {
    io::Printer::Print<>
              (printer,"if (!Equals(_extensions, other._extensions)) {\n  return false;\n}\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"  return Equals(_unknownFields, other._unknownFields);\n}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print<>(printer,"public override int GetHashCode() {\n  int hash = 1;\n");
  io::Printer::Indent(printer);
  lVar3 = 0;
  for (lVar4 = 0; pDVar2 = this->descriptor_, lVar4 < *(int *)(pDVar2 + 4); lVar4 = lVar4 + 1) {
    pFVar1 = CreateFieldGeneratorInternal
                       (this,(FieldDescriptor *)(*(long *)(pDVar2 + 0x28) + lVar3));
    (*(pFVar1->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xd])(pFVar1,printer);
    (*(pFVar1->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar1);
    lVar3 = lVar3 + 0x48;
  }
  lVar3 = 8;
  for (lVar4 = 0; lVar4 < *(int *)(pDVar2 + 0x6c); lVar4 = lVar4 + 1) {
    UnderscoresToCamelCase(&local_a0,*(string **)(*(long *)(pDVar2 + 0x30) + lVar3),false);
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,"hash ^= (int) $name$Case_;\n",(char (*) [5])0x3de831,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    pDVar2 = this->descriptor_;
    lVar3 = lVar3 + 0x28;
  }
  if (this->has_extension_ranges_ != false) {
    io::Printer::Print<>
              (printer,"if (_extensions != null) {\n  hash ^= _extensions.GetHashCode();\n}\n");
  }
  io::Printer::Print<>
            (printer,
             "if (_unknownFields != null) {\n  hash ^= _unknownFields.GetHashCode();\n}\nreturn hash;\n"
            );
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print<>
            (printer,
             "public override string ToString() {\n  return pb::JsonFormatter.ToDiagnosticString(this);\n}\n\n"
            );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateFrameworkMethods(io::Printer* printer) {
    std::map<std::string, std::string> vars;
    vars["class_name"] = class_name();

    // Equality
    WriteGeneratedCodeAttributes(printer);
    printer->Print(
        vars,
        "public override bool Equals(object other) {\n"
        "  return Equals(other as $class_name$);\n"
        "}\n\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print(
        vars,
        "public bool Equals($class_name$ other) {\n"
        "  if (ReferenceEquals(other, null)) {\n"
        "    return false;\n"
        "  }\n"
        "  if (ReferenceEquals(other, this)) {\n"
        "    return true;\n"
        "  }\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      std::unique_ptr<FieldGeneratorBase> generator(
            CreateFieldGeneratorInternal(descriptor_->field(i)));
        generator->WriteEquals(printer);
    }
    for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
      printer->Print("if ($property_name$Case != other.$property_name$Case) return false;\n",
          "property_name", UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true));
    }
    if (has_extension_ranges_) {
      printer->Print(
          "if (!Equals(_extensions, other._extensions)) {\n"
          "  return false;\n"
          "}\n");
    }
    printer->Outdent();
    printer->Print(
        "  return Equals(_unknownFields, other._unknownFields);\n"
        "}\n\n");

    // GetHashCode
    // Start with a non-zero value to easily distinguish between null and "empty" messages.
    WriteGeneratedCodeAttributes(printer);
    printer->Print(
        "public override int GetHashCode() {\n"
        "  int hash = 1;\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      std::unique_ptr<FieldGeneratorBase> generator(
            CreateFieldGeneratorInternal(descriptor_->field(i)));
        generator->WriteHash(printer);
    }
    for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
      printer->Print("hash ^= (int) $name$Case_;\n",
          "name", UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false));
    }
    if (has_extension_ranges_) {
      printer->Print(
        "if (_extensions != null) {\n"
        "  hash ^= _extensions.GetHashCode();\n"
        "}\n");
    }
    printer->Print(
        "if (_unknownFields != null) {\n"
        "  hash ^= _unknownFields.GetHashCode();\n"
        "}\n"
        "return hash;\n");
    printer->Outdent();
    printer->Print("}\n\n");

    WriteGeneratedCodeAttributes(printer);
    printer->Print(
        "public override string ToString() {\n"
        "  return pb::JsonFormatter.ToDiagnosticString(this);\n"
        "}\n\n");
}